

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int libssh2_session_supported_algs(LIBSSH2_SESSION *session,int method_type,char ***algs)

{
  uint uVar1;
  int iVar2;
  LIBSSH2_KEX_METHOD **ppLVar3;
  LIBSSH2_CRYPT_METHOD *pLVar4;
  char **ppcVar5;
  uint uVar6;
  ulong uVar7;
  char *errmsg;
  uint uVar8;
  
  if (algs == (char ***)0x0) {
    errmsg = "algs must not be NULL";
LAB_0010cd83:
    iVar2 = -0x27;
  }
  else {
    switch(method_type) {
    case 0:
      ppLVar3 = libssh2_kex_methods;
      goto LAB_0010cdae;
    case 1:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)libssh2_hostkey_methods();
      break;
    case 2:
    case 3:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)libssh2_crypt_methods();
      break;
    case 4:
    case 5:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)_libssh2_mac_methods();
      break;
    case 6:
    case 7:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)_libssh2_comp_methods(session);
      break;
    default:
      errmsg = "Unknown method type";
      iVar2 = -0x21;
      goto LAB_0010ce3c;
    case 10:
      goto switchD_0010cd73_caseD_a;
    }
    if ((LIBSSH2_CRYPT_METHOD **)ppLVar3 != (LIBSSH2_CRYPT_METHOD **)0x0) {
LAB_0010cdae:
      pLVar4 = (LIBSSH2_CRYPT_METHOD *)*ppLVar3;
      if (pLVar4 != (LIBSSH2_CRYPT_METHOD *)0x0) {
        uVar8 = 0;
        uVar7 = 1;
        do {
          uVar8 = (uVar8 + 1) - (uint)(pLVar4->name == (char *)0x0);
          pLVar4 = ((LIBSSH2_CRYPT_METHOD **)ppLVar3)[uVar7];
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (pLVar4 != (LIBSSH2_CRYPT_METHOD *)0x0);
        if (uVar8 != 0) {
          ppcVar5 = (char **)(*session->alloc)((ulong)uVar8 << 3,&session->abstract);
          *algs = ppcVar5;
          if (ppcVar5 == (char **)0x0) {
            errmsg = "Memory allocation failed";
            iVar2 = -6;
            goto LAB_0010ce3c;
          }
          pLVar4 = (LIBSSH2_CRYPT_METHOD *)*ppLVar3;
          uVar1 = 0;
          if (pLVar4 != (LIBSSH2_CRYPT_METHOD *)0x0) {
            uVar6 = 1;
            do {
              if (pLVar4->name != (char *)0x0) {
                uVar7 = (ulong)uVar1;
                uVar1 = uVar1 + 1;
                (*algs)[uVar7] = pLVar4->name;
              }
              pLVar4 = ((LIBSSH2_CRYPT_METHOD **)ppLVar3)[uVar6];
            } while ((pLVar4 != (LIBSSH2_CRYPT_METHOD *)0x0) && (uVar6 = uVar6 + 1, uVar1 < uVar8));
          }
          if (uVar1 == uVar8) {
            return uVar8;
          }
          (*session->free)(*algs,&session->abstract);
          *algs = (char **)0x0;
          errmsg = "Internal error";
          goto LAB_0010cd83;
        }
      }
    }
switchD_0010cd73_caseD_a:
    errmsg = "No algorithm found";
    iVar2 = -0x22;
  }
LAB_0010ce3c:
  iVar2 = _libssh2_error(session,iVar2,errmsg);
  return iVar2;
}

Assistant:

LIBSSH2_API int libssh2_session_supported_algs(LIBSSH2_SESSION* session,
                                               int method_type,
                                               const char ***algs)
{
    unsigned int i;
    unsigned int j;
    unsigned int ialg;
    const LIBSSH2_COMMON_METHOD **mlist;

    /* to prevent coredumps due to dereferencing of NULL */
    if(!algs)
        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "algs must not be NULL");

    switch(method_type) {
    case LIBSSH2_METHOD_KEX:
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_kex_methods;
        break;

    case LIBSSH2_METHOD_HOSTKEY:
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_hostkey_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_CS:
    case LIBSSH2_METHOD_CRYPT_SC:
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_MAC_CS:
    case LIBSSH2_METHOD_MAC_SC:
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_COMP_CS:
    case LIBSSH2_METHOD_COMP_SC:
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_SIGN_ALGO:
        /* no built-in supported list due to backend support */
        mlist = NULL;
        break;

    default:
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unknown method type");
    }  /* switch */

    /* weird situation */
    if(!mlist)
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "No algorithm found");

    /*
      mlist is looped through twice. The first time to find the number od
      supported algorithms (needed to allocate the proper size of array) and
      the second time to actually copy the pointers.  Typically this function
      will not be called often (typically at the beginning of a session) and
      the number of algorithms (i.e. number of iterations in one loop) will
      not be high (typically it will not exceed 20) for quite a long time.

      So double looping really shouldn't be an issue and it is definitely a
      better solution than reallocation several times.
    */

    /* count the number of supported algorithms */
    for(i = 0, ialg = 0; mlist[i]; i++) {
        /* do not count fields with NULL name */
        if(mlist[i]->name)
            ialg++;
    }

    /* weird situation, no algorithm found */
    if(ialg == 0)
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "No algorithm found");

    /* allocate buffer */
    *algs = (const char **) LIBSSH2_ALLOC(session, ialg*sizeof(const char *));
    if(!*algs) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Memory allocation failed");
    }
    /* Past this point *algs must be deallocated in case of an error!! */

    /* copy non-NULL pointers only */
    for(i = 0, j = 0; mlist[i] && j < ialg; i++) {
        if(!mlist[i]->name) {
            /* maybe a weird situation but if it occurs, do not include NULL
               pointers */
            continue;
        }

        /* note that [] has higher priority than * (dereferencing) */
        (*algs)[j++] = mlist[i]->name;
    }

    /* correct number of pointers copied? (test the code above) */
    if(j != ialg) {
        /* deallocate buffer */
        LIBSSH2_FREE(session, (void *)*algs);
        *algs = NULL;

        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "Internal error");
    }

    return ialg;
}